

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O1

void AstBuilder_delete(Builder *builder)

{
  if ((ItemQueue *)builder[1].reset != (ItemQueue *)0x0) {
    ItemQueue_delete((ItemQueue *)builder[1].reset);
  }
  if ((ItemQueue *)builder[1].set_error_context != (ItemQueue *)0x0) {
    ItemQueue_delete((ItemQueue *)builder[1].set_error_context);
  }
  free(builder);
  return;
}

Assistant:

void AstBuilder_delete(Builder* builder) {
    AstBuilder* ast_builder = (AstBuilder*)builder;
    if (ast_builder->stack) {
        ItemQueue_delete(ast_builder->stack);
    }
    if (ast_builder->comments) {
        ItemQueue_delete(ast_builder->comments);
    }
    free((void*)builder);
}